

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidator.cpp
# Opt level: O0

Result * validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>
                   (Result *__return_storage_ptr__,ModelDescription *interface,
                   NeuralNetworkClassifier *nn,
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *outputBlobNames,bool isUpdatable)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  NeuralNetworkMultiArrayShapeMapping NVar6;
  NeuralNetworkImageShapeMapping NVar7;
  int iVar8;
  TypeCase TVar9;
  ShapeFlexibilityCase SVar10;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar11;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *pRVar12;
  reference pFVar13;
  mapped_type *pmVar14;
  string *psVar15;
  mapped_type *this;
  FeatureType *pFVar16;
  ArrayFeatureType *pAVar17;
  RepeatedField<long> *pRVar18;
  ArrayFeatureType_EnumeratedShapes *this_00;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *this_01;
  ArrayFeatureType_ShapeRange *pAVar19;
  Result *this_02;
  size_t *this_03;
  size_type sVar20;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  bool local_8e5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_7d8;
  undefined1 local_5e8 [40];
  Result local_5c0 [3];
  runtime_error *e;
  NeuralNetworkShaper shaper;
  _Self local_498;
  _Self local_490;
  reference local_488;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *blob;
  iterator __end1_2;
  iterator __begin1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *__range1_3;
  undefined1 local_440 [8];
  NeuralNetworkSpecValidator validator;
  allocator local_371;
  string local_370;
  string local_348;
  ArrayFeatureType_Shape *shape;
  const_iterator __end5;
  const_iterator __begin5;
  RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape> *__range5;
  undefined1 local_300 [6];
  bool flexibilityIsRank1or3;
  byte local_2db;
  uchar local_2da;
  allocator local_2d9;
  bool validShapeFound;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  iterator local_2b0;
  size_type local_2a8;
  undefined1 local_2a0 [8];
  FeatureDescription *input_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1_2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  inputBlobs;
  FeatureDescription *output;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_1;
  FeatureDescription *input_1;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ioBlobNameToRank;
  string local_1d8;
  string local_1b0;
  void **local_188;
  void **local_180;
  allocator local_171;
  string local_170;
  string local_148;
  string local_120;
  string local_f8;
  string local_d0;
  NeuralNetworkLayer *layer;
  const_iterator __end0;
  const_iterator __begin0;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *__range1_1;
  FeatureDescription *input;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range1;
  undefined1 local_58 [3];
  bool hasMultiArrayInput;
  bool hasNewImageShapeMapping;
  bool hasNewArrayShapeMapping;
  bool hasNonIOS12Layer;
  bool ndArrayInterpretation;
  Result r;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputBlobNames_local;
  NeuralNetworkClassifier *nn_local;
  ModelDescription *interface_local;
  Result *_result;
  
  r.m_message.super__Rb_tree_node_base._M_right._7_1_ = isUpdatable;
  r.m_message._M_storage._M_storage = (uchar  [8])outputBlobNames;
  CoreML::Result::Result((Result *)local_58);
  bVar5 = false;
  bVar4 = false;
  bVar1 = false;
  pRVar11 = CoreML::Specification::ModelDescription::input(interface);
  __end1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                     (pRVar11);
  input = (FeatureDescription *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                    (pRVar11);
  while (bVar2 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1,(iterator *)&input), bVar2) {
    pFVar13 = google::protobuf::internal::
              RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                        (&__end1);
    pFVar16 = CoreML::Specification::FeatureDescription::type(pFVar13);
    TVar9 = CoreML::Specification::FeatureType::Type_case(pFVar16);
    if (TVar9 == kMultiArrayType) {
      bVar1 = true;
      break;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1);
  }
  NVar6 = CoreML::Specification::NeuralNetworkClassifier::arrayinputshapemapping(nn);
  bVar2 = NVar6 != RANK5_ARRAY_MAPPING;
  NVar7 = CoreML::Specification::NeuralNetworkClassifier::imageinputshapemapping(nn);
  pRVar12 = CoreML::Specification::NeuralNetworkClassifier::layers(nn);
  __end0 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::begin
                     (pRVar12);
  layer = (NeuralNetworkLayer *)
          google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::end
                    (pRVar12);
  while (bVar3 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>::operator!=
                           (&__end0,(iterator *)&layer), bVar3) {
    local_d0._M_storage._M_storage =
         (uchar  [8])
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>::operator*(&__end0);
    bVar3 = CoreML::isIOS12NeuralNetworkLayer((NeuralNetworkLayer *)local_d0._M_storage._M_storage);
    if (!bVar3) {
      bVar4 = true;
      break;
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::NeuralNetworkLayer>
    ::operator++(&__end0);
  }
  if (((bVar4) || (bVar2)) || (NVar7 != RANK5_IMAGE_MAPPING)) {
    bVar5 = true;
  }
  if (((bVar4) && (!bVar2)) && (bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_d0,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the network contains a layer added in version 4 (iOS 13) or later. Use \'EXACT_ARRAY_MAPPING\' instead."
               ,(allocator *)(local_f8._M_storage._M_storage + 7));
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)(local_f8._M_storage._M_storage + 7));
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  if (((!bVar2) && (NVar7 != RANK5_IMAGE_MAPPING)) && (bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_f8,
               "Neural Network Multi-Array input shape mapping cannot be \'RANK5_ARRAY_MAPPING\' if the image input Shape mapping is not \'RANK5_IMAGE_MAPPING\'"
               ,(allocator *)(local_120._M_storage._M_storage + 7));
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)(local_120._M_storage._M_storage + 7));
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  iVar8 = CoreML::Specification::ModelDescription::input_size(interface);
  if (iVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_120,"Neural networks require at least one input.",
               (allocator *)(local_148._M_storage._M_storage + 7));
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)(local_148._M_storage._M_storage + 7));
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  iVar8 = CoreML::Specification::ModelDescription::output_size(interface);
  if (iVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_148,"Neural networks produce at least one output.",
               (allocator *)(local_170._M_storage._M_storage + 7));
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)(local_170._M_storage._M_storage + 7));
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  pRVar12 = CoreML::Specification::NeuralNetworkClassifier::layers(nn);
  iVar8 = google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::size
                    (pRVar12);
  if (iVar8 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_170,"Neural networks require at least one layer.",&local_171);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  pRVar11 = CoreML::Specification::ModelDescription::input(interface);
  local_180 = (void **)google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                       ::begin(pRVar11);
  pRVar11 = CoreML::Specification::ModelDescription::input(interface);
  local_188 = (void **)google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>
                       ::end(pRVar11);
  bVar4 = std::
          all_of<google::protobuf::internal::RepeatedPtrIterator<CoreML::Specification::FeatureDescription_const>,validateNeuralNetworkTopLevel<CoreML::Specification::NeuralNetworkClassifier>(CoreML::Specification::ModelDescription_const&,CoreML::Specification::NeuralNetworkClassifier_const&,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&,bool)::_lambda(CoreML::Specification::FeatureDescription_const&)_1_>
                    (local_180,local_188);
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1b0,"Neural networks require at least one non-optional input.",
               (allocator *)(local_1d8._M_storage._M_storage + 7));
    CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)(local_1d8._M_storage._M_storage + 7));
    local_f8._M_storage._M_storage[0] = '\x01';
    local_f8._M_storage._M_storage[1] = '\0';
    local_f8._M_storage._M_storage[2] = '\0';
    local_f8._M_storage._M_storage[3] = '\0';
    goto LAB_003830b8;
  }
  local_1d8._M_storage._M_storage[6] = 0;
  pRVar11 = CoreML::Specification::ModelDescription::input(interface);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"inputs",
             (allocator *)
             ((long)&ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  CoreML::validateInputOutputTypes
            (__return_storage_ptr__,pRVar11,MODEL_INPUT_TYPE_INVALID,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ioBlobNameToRank._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  bVar4 = CoreML::Result::good(__return_storage_ptr__);
  if (!bVar4) {
    local_1d8._M_storage._M_storage[6] = 1;
  }
  local_f8._M_storage._M_storage._1_3_ = 0;
  local_f8._M_storage._M_storage[0] = !bVar4;
  if ((local_1d8._M_storage._M_storage[6] & 1) == 0) {
    CoreML::Result::~Result(__return_storage_ptr__);
  }
  if (local_f8._M_storage._M_storage._0_4_ != 0) goto LAB_003830b8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         *)&__range2);
  if (bVar5 != false) {
    pRVar11 = CoreML::Specification::ModelDescription::input(interface);
    __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar11);
    input_1 = (FeatureDescription *)
              google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                        (pRVar11);
    while (bVar4 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2,(iterator *)&input_1), bVar4) {
      pFVar13 = google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                          (&__end2);
      pFVar16 = CoreML::Specification::FeatureDescription::type(pFVar13);
      TVar9 = CoreML::Specification::FeatureType::Type_case(pFVar16);
      if (TVar9 == kMultiArrayType) {
        NVar6 = CoreML::Specification::NeuralNetworkClassifier::arrayinputshapemapping(nn);
        if (NVar6 == RANK5_ARRAY_MAPPING) {
          psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(pFVar13);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)&__range2,(key_type *)psVar15);
          *pmVar14 = 5;
        }
        else {
          pFVar16 = CoreML::Specification::FeatureDescription::type(pFVar13);
          pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
          iVar8 = CoreML::Specification::ArrayFeatureType::shape_size(pAVar17);
          psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(pFVar13);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)&__range2,(key_type *)psVar15);
          *pmVar14 = iVar8;
        }
      }
      else {
        pFVar16 = CoreML::Specification::FeatureDescription::type(pFVar13);
        TVar9 = CoreML::Specification::FeatureType::Type_case(pFVar16);
        if (TVar9 == kImageType) {
          NVar7 = CoreML::Specification::NeuralNetworkClassifier::imageinputshapemapping(nn);
          if (NVar7 == RANK5_IMAGE_MAPPING) {
            psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(pFVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)&__range2,(key_type *)psVar15);
            *pmVar14 = 5;
          }
          else {
            psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_(pFVar13);
            pmVar14 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                    *)&__range2,(key_type *)psVar15);
            *pmVar14 = 4;
          }
        }
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2);
    }
    pRVar11 = CoreML::Specification::ModelDescription::output(interface);
    __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar11);
    output = (FeatureDescription *)
             google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                       (pRVar11);
    while (bVar4 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2_1,(iterator *)&output), bVar4) {
      inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                             (&__end2_1);
      pFVar16 = CoreML::Specification::FeatureDescription::type
                          ((FeatureDescription *)
                           inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      TVar9 = CoreML::Specification::FeatureType::Type_case(pFVar16);
      if (TVar9 == kMultiArrayType) {
        pFVar16 = CoreML::Specification::FeatureDescription::type
                            ((FeatureDescription *)
                             inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
        iVar8 = CoreML::Specification::ArrayFeatureType::shape_size(pAVar17);
        if (iVar8 != 0) {
          pFVar16 = CoreML::Specification::FeatureDescription::type
                              ((FeatureDescription *)
                               inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
          iVar8 = CoreML::Specification::ArrayFeatureType::shape_size(pAVar17);
          psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_
                              ((FeatureDescription *)
                               inputBlobs._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                  *)&__range2,(key_type *)psVar15);
          *pmVar14 = iVar8;
        }
      }
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2_1);
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *)&__range1_2);
  pRVar11 = CoreML::Specification::ModelDescription::input(interface);
  __end1_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                       (pRVar11);
  input_2 = (FeatureDescription *)
            google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end
                      (pRVar11);
  while (bVar4 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                           (&__end1_1,(iterator *)&input_2), bVar4) {
    local_2a0 = (undefined1  [8])
                google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                          (&__end1_1);
    local_2da = '\x01';
    pbStack_2d8 = &local_2d0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d0,"__input",&local_2d9);
    local_2da = '\0';
    local_2b0 = &local_2d0;
    local_2a8 = 1;
    psVar15 = CoreML::Specification::FeatureDescription::name_abi_cxx11_
                        ((FeatureDescription *)local_2a0);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)&__range1_2,(key_type *)psVar15);
    __l._M_len = local_2a8;
    __l._M_array = local_2b0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(this,__l);
    local_7d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2b0;
    do {
      local_7d8 = local_7d8 + -1;
      std::__cxx11::string::~string((string *)local_7d8);
    } while (local_7d8 != &local_2d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0);
    TVar9 = CoreML::Specification::FeatureType::Type_case(pFVar16);
    if (TVar9 == kMultiArrayType) {
      if (bVar5 == false) {
        local_2db = 0;
        pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0);
        pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
        pRVar18 = CoreML::Specification::ArrayFeatureType::shape(pAVar17);
        iVar8 = google::protobuf::RepeatedField<long>::size(pRVar18);
        if (0 < iVar8) {
          pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0)
          ;
          pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
          pRVar18 = CoreML::Specification::ArrayFeatureType::shape(pAVar17);
          iVar8 = google::protobuf::RepeatedField<long>::size(pRVar18);
          if (iVar8 != 1) {
            pFVar16 = CoreML::Specification::FeatureDescription::type
                                ((FeatureDescription *)local_2a0);
            pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
            pRVar18 = CoreML::Specification::ArrayFeatureType::shape(pAVar17);
            iVar8 = google::protobuf::RepeatedField<long>::size(pRVar18);
            if (iVar8 != 3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_300,
                         "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                         ,(allocator *)((long)&__range5 + 7));
              CoreML::Result::Result
                        (__return_storage_ptr__,INVALID_MODEL_INTERFACE,(string *)local_300);
              std::__cxx11::string::~string((string *)local_300);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
              local_f8._M_storage._M_storage[0] = '\x01';
              local_f8._M_storage._M_storage[1] = '\0';
              local_f8._M_storage._M_storage[2] = '\0';
              local_f8._M_storage._M_storage[3] = '\0';
              goto LAB_00383084;
            }
          }
          local_2db = 1;
        }
        __range5._6_1_ = 1;
        pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0);
        pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
        SVar10 = CoreML::Specification::ArrayFeatureType::ShapeFlexibility_case(pAVar17);
        if (SVar10 == SHAPEFLEXIBILITY_NOT_SET) {
          __range5._6_1_ = 0;
        }
        else if (SVar10 == kEnumeratedShapes) {
          pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0)
          ;
          pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
          this_00 = CoreML::Specification::ArrayFeatureType::enumeratedshapes(pAVar17);
          this_01 = CoreML::Specification::ArrayFeatureType_EnumeratedShapes::shapes(this_00);
          __end5 = google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>
                   ::begin(this_01);
          shape = (ArrayFeatureType_Shape *)
                  google::protobuf::RepeatedPtrField<CoreML::Specification::ArrayFeatureType_Shape>
                  ::end(this_01);
          while (bVar4 = google::protobuf::internal::
                         RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::
                         operator!=(&__end5,(iterator *)&shape), bVar4) {
            local_348._M_storage._M_storage =
                 (uchar  [8])
                 google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::operator*
                           (&__end5);
            iVar8 = CoreML::Specification::ArrayFeatureType_Shape::shape_size
                              ((ArrayFeatureType_Shape *)local_348._M_storage._M_storage);
            if ((iVar8 != 1) &&
               (iVar8 = CoreML::Specification::ArrayFeatureType_Shape::shape_size
                                  ((ArrayFeatureType_Shape *)local_348._M_storage._M_storage),
               iVar8 != 3)) {
              __range5._6_1_ = 0;
              break;
            }
            google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::ArrayFeatureType_Shape>::operator++
                      (&__end5);
          }
        }
        else if (SVar10 == kShapeRange) {
          pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0)
          ;
          pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
          pAVar19 = CoreML::Specification::ArrayFeatureType::shaperange(pAVar17);
          iVar8 = CoreML::Specification::ArrayFeatureType_ShapeRange::sizeranges_size(pAVar19);
          local_8e5 = true;
          if (iVar8 != 1) {
            pFVar16 = CoreML::Specification::FeatureDescription::type
                                ((FeatureDescription *)local_2a0);
            pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
            pAVar19 = CoreML::Specification::ArrayFeatureType::shaperange(pAVar17);
            iVar8 = CoreML::Specification::ArrayFeatureType_ShapeRange::sizeranges_size(pAVar19);
            local_8e5 = iVar8 == 3;
          }
          __range5._6_1_ = local_8e5;
        }
        if (((__range5._6_1_ & 1) == 0) && ((local_2db & 1) == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_348,
                     "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                     ,(allocator *)(local_370._M_storage._M_storage + 7));
          CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator((allocator<char> *)(local_370._M_storage._M_storage + 7))
          ;
          local_f8._M_storage._M_storage[0] = '\x01';
          local_f8._M_storage._M_storage[1] = '\0';
          local_f8._M_storage._M_storage[2] = '\0';
          local_f8._M_storage._M_storage[3] = '\0';
          goto LAB_00383084;
        }
        if ((__range5._6_1_ & 1) != 0) {
          local_2db = 1;
        }
        if ((local_2db & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_370,
                     "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays)."
                     ,&local_371);
          CoreML::Result::Result(__return_storage_ptr__,INVALID_MODEL_INTERFACE,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::allocator<char>::~allocator((allocator<char> *)&local_371);
          local_f8._M_storage._M_storage[0] = '\x01';
          local_f8._M_storage._M_storage[1] = '\0';
          local_f8._M_storage._M_storage[2] = '\0';
          local_f8._M_storage._M_storage[3] = '\0';
          goto LAB_00383084;
        }
      }
      else {
        pFVar16 = CoreML::Specification::FeatureDescription::type((FeatureDescription *)local_2a0);
        pAVar17 = CoreML::Specification::FeatureType::multiarraytype(pFVar16);
        CoreML::validateNdMultiArrayInputType((Result *)&validator.loopStackDepth,pAVar17);
        this_02 = CoreML::Result::operator=((Result *)local_58,(Result *)&validator.loopStackDepth);
        bVar4 = CoreML::Result::good(this_02);
        CoreML::Result::~Result((Result *)&validator.loopStackDepth);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
          local_f8._M_storage._M_storage[0] = '\x01';
          local_f8._M_storage._M_storage[1] = '\0';
          local_f8._M_storage._M_storage[2] = '\0';
          local_f8._M_storage._M_storage[3] = '\0';
          goto LAB_00383084;
        }
      }
    }
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>
    ::operator++(&__end1_1);
  }
  CoreML::NeuralNetworkSpecValidator::NeuralNetworkSpecValidator
            ((NeuralNetworkSpecValidator *)local_440,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              *)&__range1_2,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&__range2,bVar5,0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&__range2);
  CoreML::NeuralNetworkSpecValidator::
  validateNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
            ((Result *)&__range1_3,(NeuralNetworkSpecValidator *)local_440,nn);
  CoreML::Result::operator=((Result *)local_58,(Result *)&__range1_3);
  CoreML::Result::~Result((Result *)&__range1_3);
  bVar4 = CoreML::Result::good((Result *)local_58);
  if (bVar4) {
    this_03 = &validator.blobNameToRank._M_t._M_impl.super__Rb_tree_header._M_node_count;
    __end1_2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                        *)this_03);
    blob = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)this_03);
    while (bVar4 = std::operator!=(&__end1_2,(_Self *)&blob), bVar4) {
      local_488 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator*(&__end1_2);
      local_490._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&__range1_2,&local_488->first);
      local_498._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  *)&__range1_2);
      bVar4 = std::operator==(&local_490,&local_498);
      if (bVar4) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)r.m_message._M_storage._M_storage,(value_type *)local_488);
      }
      else {
        sVar20 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&local_488->second);
        if (1 < sVar20) {
          pVar21 = std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)r.m_message._M_storage._M_storage,(value_type *)local_488);
          shaper.blobShapes._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)pVar21.first._M_node;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end1_2);
    }
    if (bVar5 == false) {
      pRVar12 = CoreML::Specification::NeuralNetworkClassifier::layers(nn);
      CoreML::NeuralNetworkShaper::NeuralNetworkShaper
                ((NeuralNetworkShaper *)&e,interface,pRVar12,true);
      CoreML::NeuralNetworkShaper::~NeuralNetworkShaper((NeuralNetworkShaper *)&e);
    }
    bVar5 = CoreML::Result::good((Result *)local_58);
    if (bVar5) {
      if ((r.m_message.super__Rb_tree_node_base._M_right._7_1_ & 1) == 0) {
LAB_0038304e:
        CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
      }
      else {
        validateUpdatableNeuralNetwork<CoreML::Specification::NeuralNetworkClassifier>
                  ((Result_conflict *)(local_5e8 + 0x28),nn);
        CoreML::Result::operator=((Result *)local_58,(Result *)(local_5e8 + 0x28));
        CoreML::Result::~Result((Result *)(local_5e8 + 0x28));
        bVar5 = CoreML::Result::good((Result *)local_58);
        if (bVar5) {
          validateTrainingInputs<CoreML::Specification::NeuralNetworkClassifier>
                    ((Result_conflict *)local_5e8,interface,nn);
          CoreML::Result::operator=((Result *)local_58,(Result *)local_5e8);
          CoreML::Result::~Result((Result *)local_5e8);
          bVar5 = CoreML::Result::good((Result *)local_58);
          if (bVar5) goto LAB_0038304e;
          CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
        }
        else {
          CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
        }
      }
    }
    else {
      CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
    }
  }
  else {
    CoreML::Result::Result(__return_storage_ptr__,(Result *)local_58);
  }
  local_f8._M_storage._M_storage[0] = '\x01';
  local_f8._M_storage._M_storage[1] = '\0';
  local_f8._M_storage._M_storage[2] = '\0';
  local_f8._M_storage._M_storage[3] = '\0';
  CoreML::NeuralNetworkSpecValidator::~NeuralNetworkSpecValidator
            ((NeuralNetworkSpecValidator *)local_440);
LAB_00383084:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          *)&__range1_2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)&__range2);
LAB_003830b8:
  CoreML::Result::~Result((Result *)local_58);
  return __return_storage_ptr__;
}

Assistant:

Result validateNeuralNetworkTopLevel(const Specification::ModelDescription& interface,
                                     const T& nn, std::set<std::string>& outputBlobNames,
                                     bool isUpdatable) {
    Result r;
    
    // First calculate the value of the flag "ndArrayInterpretation"
    // ndArrayInterpretation == False ==> iOS 11/12 (old) execution path can be used, i.e. all tensors are static rank 5.
    // ndArrayInterpretation == True ==>  Tensors can have any rank (including 5).
    
    bool ndArrayInterpretation = false;

    bool hasNonIOS12Layer = false;
    bool hasNewArrayShapeMapping = false;
    bool hasNewImageShapeMapping = false;
    bool hasMultiArrayInput = false;

    for (const auto& input: interface.input()) {
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            hasMultiArrayInput = true;
            break;
        }
    }
    
    if (nn.arrayinputshapemapping() != Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
        hasNewArrayShapeMapping = true;
    }
    
    if (nn.imageinputshapemapping() != Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
        hasNewImageShapeMapping = true;
    }
    
    for (const auto &layer: nn.layers()) {
        if (!isIOS12NeuralNetworkLayer(layer)) {
            hasNonIOS12Layer = true;
            break;
        }
    }
    
    if (hasNonIOS12Layer || hasNewArrayShapeMapping || hasNewImageShapeMapping) {
        ndArrayInterpretation = true;
    }
    
    if (hasNonIOS12Layer && !hasNewArrayShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the network contains a layer added in version 4 (iOS 13) or later. Use 'EXACT_ARRAY_MAPPING' instead.");
    }
    
    if (!hasNewArrayShapeMapping && hasNewImageShapeMapping && hasMultiArrayInput) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural Network Multi-Array input shape mapping cannot be 'RANK5_ARRAY_MAPPING' if the image input Shape mapping is not 'RANK5_IMAGE_MAPPING'");
    }
    
    //==================== End of logic to determine the value of "ndArrayInterpretation" ======================
    
    if (interface.input_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks require at least one input.");
    }
    
    if (interface.output_size() == 0) {
        return Result(ResultType::INVALID_MODEL_INTERFACE,
                      "Neural networks produce at least one output.");
    }
    
    if (nn.layers().size() == 0) {
        return Result(ResultType::INVALID_MODEL_PARAMETERS,
                      "Neural networks require at least one layer.");
    }
    
    if (std::all_of(interface.input().begin(), interface.input().end(),
                    [](const Specification::FeatureDescription& input) {
                        return input.type().isoptional();
                    })) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE,
                                      "Neural networks require at least one non-optional input.");
                    }

    // Check the input types
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputTypes(interface.input(), ResultReason::MODEL_INPUT_TYPE_INVALID, "inputs"));

    std::map<std::string, int> ioBlobNameToRank; // to collect ranks of input/output blobs from the shapes present in the description
    
    // populate "ioBlobNameToRank"
    if (ndArrayInterpretation) {
        for (const auto& input: interface.input()) {
            if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (nn.arrayinputshapemapping() == Specification::NeuralNetworkMultiArrayShapeMapping::RANK5_ARRAY_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = input.type().multiarraytype().shape_size();
                }
            } else if (input.type().Type_case() == Specification::FeatureType::kImageType) {
                if (nn.imageinputshapemapping() == Specification::NeuralNetworkImageShapeMapping::RANK5_IMAGE_MAPPING) {
                    ioBlobNameToRank[input.name()] = 5;
                } else {
                    ioBlobNameToRank[input.name()] = 4;
                }
            }
        }
        for (const auto& output: interface.output()) {
            if (output.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
                if (output.type().multiarraytype().shape_size()) {
                    ioBlobNameToRank[output.name()] = output.type().multiarraytype().shape_size();
                }
            }
        }
    }
    
    // Collect Model input names and do some checking
    
    // inputBlobs: For each named data blob, the name of the node which produced it (there can be multiple in if-else branches)
    std::map<std::string, std::set<std::string>> inputBlobs;
    for (const auto& input: interface.input()) {
        // For input blobs, we'll give them a dummy producing layer name
        inputBlobs[input.name()] = {"__input"};
        if (input.type().Type_case() == Specification::FeatureType::kMultiArrayType) {
            
            if (!ndArrayInterpretation) {
                
                // only vector-like (rank 1) or image-like (rank 3) inputs are allowed
                bool validShapeFound = false;
                if (input.type().multiarraytype().shape().size() > 0) {
                    if (!(input.type().multiarraytype().shape().size() == 1
                          || input.type().multiarraytype().shape().size() == 3)) {
                        return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                    }
                    else {
                        validShapeFound = true;
                    }
                }
                bool flexibilityIsRank1or3 = true;
                switch (input.type().multiarraytype().ShapeFlexibility_case()) {
                    case CoreML::Specification::ArrayFeatureType::kEnumeratedShapes:
                        for (const auto &shape : input.type().multiarraytype().enumeratedshapes().shapes()) {
                            if(shape.shape_size() != 1 && shape.shape_size() != 3) {
                                flexibilityIsRank1or3 = false;
                                break;
                            }
                        }
                        break;
                    case CoreML::Specification::ArrayFeatureType::kShapeRange:
                        flexibilityIsRank1or3 = (input.type().multiarraytype().shaperange().sizeranges_size() == 1 ||
                                                 input.type().multiarraytype().shaperange().sizeranges_size() == 3);
                        break;
                    case CoreML::Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                        flexibilityIsRank1or3 = false;
                        break;
                }
                if (!flexibilityIsRank1or3 && !validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                } else if (flexibilityIsRank1or3) {
                    validShapeFound = true;
                }
                if (!validShapeFound) {
                    return Result(ResultType::INVALID_MODEL_INTERFACE, "Input MLMultiArray to neural networks must have dimension 1 (vector) or 3 (image-like arrays).");
                }
                
            } else { // validate input shape when "ndArrayInterpretation" is True

                if (!(r = validateNdMultiArrayInputType(input.type().multiarraytype())).good()) {
                    return r;
                }
            } // if else block on spec version to check validity of input shape
        }
    }
    
    // validate the Neural Network message
    
    //  create an object to validate neural network message
    NeuralNetworkSpecValidator validator(inputBlobs, ioBlobNameToRank, ndArrayInterpretation, 0, ioBlobNameToRank);
    
    r = validator.validateNeuralNetwork(nn);
    
    if (!r.good()) {
        return r;
    }
    
    // gather all output blobs of the graph
    for (auto& blob: validator.blobs){
        if (inputBlobs.find(blob.first) == inputBlobs.end()) {
            outputBlobNames.insert(blob.first);
        } else {
            // if we are here, this means this blob is also present in the set of "inputBlobs"
            // but it can still be a genuine output blob if multiple layers are generating it (e.g. copy layer)
            if (blob.second.size() > 1) {
                outputBlobNames.insert(blob.first);
            }
        }
    }
    
    // Call the shaper: compatibility with iOS 12
    if (!ndArrayInterpretation) {
        // Compute the shapes
        try {
            NeuralNetworkShaper shaper(interface, nn.layers());
        }
        catch(std::runtime_error& e) {
            std::string err = std::string("Error determining network blob shapes: ") + std::string(e.what());
            return Result(ResultType::POTENTIALLY_INVALID_NEURAL_NETWORK_SHAPES, err);
        }
    }
    
    if (!r.good()) {
        return r;
    }
    
    if (isUpdatable) {
        r = validateUpdatableNeuralNetwork(nn);
        if (!r.good()) { return r; }

        r = validateTrainingInputs(interface, nn);
        if (!r.good()) { return r; }
    }
    
    return r;
    
}